

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t checksum(archive_read *a,void *h)

{
  char cVar1;
  int64_t iVar2;
  long in_RSI;
  char c;
  size_t i;
  wchar_t sum;
  wchar_t check;
  archive_entry_header_ustar *header;
  uchar *bytes;
  char *in_stack_ffffffffffffffb8;
  ulong local_38;
  int local_2c;
  wchar_t local_4;
  
  local_38 = 0;
  while( true ) {
    if (7 < local_38) {
      iVar2 = tar_atol(in_stack_ffffffffffffffb8,0x14e695);
      local_2c = 0;
      for (local_38 = 0; local_38 < 0x94; local_38 = local_38 + 1) {
        local_2c = (uint)*(byte *)(in_RSI + local_38) + local_2c;
      }
      for (; local_38 < 0x9c; local_38 = local_38 + 1) {
        local_2c = local_2c + 0x20;
      }
      for (; local_38 < 0x200; local_38 = local_38 + 1) {
        local_2c = (uint)*(byte *)(in_RSI + local_38) + local_2c;
      }
      if ((int)iVar2 == local_2c) {
        local_4 = L'\x01';
      }
      else {
        local_2c = 0;
        for (local_38 = 0; local_38 < 0x94; local_38 = local_38 + 1) {
          local_2c = *(char *)(in_RSI + local_38) + local_2c;
        }
        for (; local_38 < 0x9c; local_38 = local_38 + 1) {
          local_2c = local_2c + 0x20;
        }
        for (; local_38 < 0x200; local_38 = local_38 + 1) {
          local_2c = *(char *)(in_RSI + local_38) + local_2c;
        }
        if ((int)iVar2 == local_2c) {
          local_4 = L'\x01';
        }
        else {
          local_4 = L'\0';
        }
      }
      return local_4;
    }
    cVar1 = *(char *)(in_RSI + 0x94 + local_38);
    if (((cVar1 != ' ') && (cVar1 != '\0')) && ((cVar1 < '0' || ('7' < cVar1)))) break;
    local_38 = local_38 + 1;
  }
  return L'\0';
}

Assistant:

static int
checksum(struct archive_read *a, const void *h)
{
	const unsigned char *bytes;
	const struct archive_entry_header_ustar	*header;
	int check, sum;
	size_t i;

	(void)a; /* UNUSED */
	bytes = (const unsigned char *)h;
	header = (const struct archive_entry_header_ustar *)h;

	/* Checksum field must hold an octal number */
	for (i = 0; i < sizeof(header->checksum); ++i) {
		char c = header->checksum[i];
		if (c != ' ' && c != '\0' && (c < '0' || c > '7'))
			return 0;
	}

	/*
	 * Test the checksum.  Note that POSIX specifies _unsigned_
	 * bytes for this calculation.
	 */
	sum = (int)tar_atol(header->checksum, sizeof(header->checksum));
	check = 0;
	for (i = 0; i < 148; i++)
		check += (unsigned char)bytes[i];
	for (; i < 156; i++)
		check += 32;
	for (; i < 512; i++)
		check += (unsigned char)bytes[i];
	if (sum == check)
		return (1);

	/*
	 * Repeat test with _signed_ bytes, just in case this archive
	 * was created by an old BSD, Solaris, or HP-UX tar with a
	 * broken checksum calculation.
	 */
	check = 0;
	for (i = 0; i < 148; i++)
		check += (signed char)bytes[i];
	for (; i < 156; i++)
		check += 32;
	for (; i < 512; i++)
		check += (signed char)bytes[i];
	if (sum == check)
		return (1);

	return (0);
}